

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O1

QDataStream *
QtPrivate::readArrayBasedContainer<QList<QByteArray>>(QDataStream *s,QList<QByteArray> *c)

{
  Status SVar1;
  QArrayData *asize;
  long in_FS_OFFSET;
  qint64 extendedLen;
  quint32 first;
  QByteArray local_68;
  uint local_4c;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver((StreamStateSaver *)local_48,s);
  QList<QByteArray>::clear(c);
  local_4c = 0xaaaaaaaa;
  QDataStream::operator>>(s,(qint32 *)&local_4c);
  asize = (QArrayData *)(ulong)local_4c;
  if (asize == (QArrayData *)0xffffffff) {
    asize = (QArrayData *)0xffffffffffffffff;
  }
  else if ((local_4c == 0xfffffffe) && (0x15 < s->ver)) {
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(s,(qint64 *)&local_68);
    asize = &(local_68.d.d)->super_QArrayData;
  }
  if ((long)asize < 0) {
    QDataStream::setStatus(s,SizeLimitExceeded);
  }
  else {
    QList<QByteArray>::reserve(c,(qsizetype)asize);
    do {
      if (asize == (QArrayData *)0x0) break;
      asize = (QArrayData *)((long)&asize[-1].alloc + 7);
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (char *)0x0;
      local_68.d.size = 0;
      ::operator>>(s,&local_68);
      SVar1 = QDataStream::status(s);
      if (SVar1 == Ok) {
        QMovableArrayOps<QByteArray>::emplace<QByteArray_const&>
                  ((QMovableArrayOps<QByteArray> *)c,(c->d).size,&local_68);
        QList<QByteArray>::end(c);
      }
      else {
        QList<QByteArray>::clear(c);
      }
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
        }
      }
    } while (SVar1 == Ok);
  }
  if (local_48._8_4_ != Ok) {
    QDataStream::resetStatus((QDataStream *)local_48._0_8_);
    QDataStream::setStatus((QDataStream *)local_48._0_8_,local_48._8_4_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}